

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_AlignPlane(sector_t *sec,line_t *line,int which)

{
  double *pdVar1;
  vertex_t *pvVar2;
  bool bVar3;
  sector_t *psVar4;
  vertex_t *pvVar5;
  line_t **pplVar6;
  uint uVar7;
  long lVar8;
  line_t *plVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  if (line->backsector != (sector_t *)0x0) {
    pplVar6 = sec->lines;
    pvVar5 = (*pplVar6)->v1;
    pvVar2 = line->v1;
    if (sec->linecount < 1) {
      dVar10 = (line->delta).X;
      dVar11 = (line->delta).Y;
      dVar15 = (pvVar2->p).X;
      dVar12 = (pvVar2->p).Y;
    }
    else {
      dVar15 = (pvVar2->p).X;
      dVar12 = (pvVar2->p).Y;
      dVar10 = (line->delta).X;
      dVar11 = (line->delta).Y;
      dVar13 = 0.0;
      uVar7 = (uint)(ushort)sec->linecount * 2;
      do {
        if ((uVar7 & 1) == 0) {
          plVar9 = *pplVar6;
        }
        else {
          plVar9 = *pplVar6;
          pplVar6 = pplVar6 + 1;
          plVar9 = (line_t *)&plVar9->v2;
        }
        pvVar2 = plVar9->v1;
        dVar16 = ABS((dVar12 - (pvVar2->p).Y) * dVar10 - (dVar15 - (pvVar2->p).X) * dVar11);
        if (dVar16 <= dVar13) {
          dVar16 = dVar13;
          pvVar2 = pvVar5;
        }
        pvVar5 = pvVar2;
        dVar13 = dVar16;
        bVar3 = 1 < (int)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar3);
    }
    psVar4 = line->backsector;
    if (line->frontsector != sec) {
      psVar4 = line->frontsector;
    }
    lVar8 = 0xa8;
    if (which == 0) {
      lVar8 = 0x50;
    }
    dVar13 = *(double *)((long)&psVar4->planes[0].xform.xOffs + lVar8);
    dVar12 = (pvVar5->p).Y - dVar12;
    dVar14 = *(double *)((long)&sec->planes[0].xform.xOffs + lVar8) - dVar13;
    dVar15 = (pvVar5->p).X - dVar15;
    dVar16 = dVar11 * dVar14 - dVar12 * 0.0;
    dVar14 = dVar15 * 0.0 - dVar10 * dVar14;
    dVar12 = dVar12 * dVar10 - dVar15 * dVar11;
    dVar15 = c_sqrt(dVar12 * dVar12 + dVar14 * dVar14 + dVar16 * dVar16);
    lVar8 = 0xd8;
    dVar15 = (double)(~-(ulong)(dVar15 != 0.0) & (ulong)dVar15 |
                     (ulong)(1.0 / dVar15) & -(ulong)(dVar15 != 0.0));
    dVar16 = dVar15 * dVar16;
    dVar14 = dVar15 * dVar14;
    dVar15 = dVar15 * dVar12;
    if (((which == 0) && (lVar8 = 0xb0, dVar15 < 0.0)) || ((which == 1 && (0.0 < dVar15)))) {
      dVar16 = -dVar16;
      dVar14 = -dVar14;
      dVar15 = -dVar15;
    }
    dVar12 = (line->v1->p).X;
    dVar10 = (line->v1->p).Y;
    pdVar1 = (double *)((long)&sec->planes[0].xform.xOffs + lVar8);
    *pdVar1 = dVar16;
    pdVar1[1] = dVar14;
    *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar8) = dVar15;
    *(double *)((long)&sec->planes[0].xform.xScale + lVar8) =
         (-dVar16 * dVar12 - dVar14 * dVar10) - dVar13 * dVar15;
    *(double *)((long)&sec->planes[0].xform.yScale + lVar8) = -1.0 / dVar15;
  }
  return;
}

Assistant:

static void P_AlignPlane(sector_t *sec, line_t *line, int which)
{
	sector_t *refsec;
	double bestdist;
	vertex_t *refvert = (*sec->lines)->v1;	// Shut up, GCC
	int i;
	line_t **probe;

	if (line->backsector == NULL)
		return;

	// Find furthest vertex from the reference line. It, along with the two ends
	// of the line, will define the plane.
	bestdist = 0;
	for (i = sec->linecount * 2, probe = sec->lines; i > 0; i--)
	{
		double dist;
		vertex_t *vert;

		if (i & 1)
			vert = (*probe++)->v2;
		else
			vert = (*probe)->v1;
		dist = fabs((line->v1->fY() - vert->fY()) * line->Delta().X -
			(line->v1->fX() - vert->fX()) * line->Delta().Y);

		if (dist > bestdist)
		{
			bestdist = dist;
			refvert = vert;
		}
	}

	refsec = line->frontsector == sec ? line->backsector : line->frontsector;

	DVector3 p, v1, v2, cross;

	secplane_t *srcplane;
	double srcheight, destheight;

	srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
	srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);
	destheight = (which == 0) ? refsec->GetPlaneTexZ(sector_t::floor) : refsec->GetPlaneTexZ(sector_t::ceiling);

	p[0] = line->v1->fX();
	p[1] = line->v1->fY();
	p[2] = destheight;
	v1[0] = line->Delta().X;
	v1[1] = line->Delta().Y;
	v1[2] = 0;
	v2[0] = refvert->fX() - line->v1->fX();
	v2[1] = refvert->fY() - line->v1->fY();
	v2[2] = srcheight - destheight;

	cross = (v1 ^ v2).Unit();

	// Fix backward normals
	if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
	{
		cross = -cross;
	}

	double dist = -cross[0] * line->v1->fX() - cross[1] * line->v1->fY() - cross[2] * destheight;
	srcplane->set(cross[0], cross[1], cross[2], dist);
}